

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

void __thiscall
Hpipe::Instruction::apply(Instruction *this,function<void_(Hpipe::Instruction_*)> *f,bool subgraphs)

{
  undefined7 in_register_00000011;
  _Any_data _Stack_38;
  code *local_28;
  
  cur_op_id = cur_op_id + 1;
  std::function<void_(Hpipe::Instruction_*)>::function
            ((function<void_(Hpipe::Instruction_*)> *)&_Stack_38,f);
  (*this->_vptr_Instruction[6])
            (this,&_Stack_38,CONCAT71(in_register_00000011,subgraphs) & 0xffffffff);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return;
}

Assistant:

void Instruction::apply( std::function<void (Instruction *)> f, bool subgraphs ) {
    ++cur_op_id;
    apply_rec( f, subgraphs );
}